

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_AddingEqualPoints_Test::TestBody
          (ECCurveTest_AddingEqualPoints_Test *this)

{
  int iVar1;
  ParamType_conflict *pPVar2;
  EC_POINT *pEVar3;
  EC_POINT *src;
  ec_point_st *dst;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> double_p1;
  UniquePtr<EC_POINT> p2;
  UniquePtr<EC_POINT> p1_plus_p2;
  UniquePtr<BN_CTX> ctx;
  AssertionResult gtest_ar;
  UniquePtr<EC_POINT> p1;
  UniquePtr<EC_KEY> key;
  Message local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  _Head_base<0UL,_ec_point_st_*,_false> local_68;
  _Head_base<0UL,_ec_point_st_*,_false> local_60;
  _Head_base<0UL,_ec_point_st_*,_false> local_58;
  _Head_base<0UL,_bignum_ctx_*,_false> local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  AssertHelper local_20;
  _Head_base<0UL,_ec_key_st_*,_false> local_18;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  local_18._M_head_impl = (ec_key_st *)EC_KEY_new_by_curve_name(*pPVar2);
  local_80.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_80.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_18._M_head_impl != (ec_key_st *)0x0);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (ec_key_st *)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_80,(AssertionResult *)0x607821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x2a3,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_28);
  }
  else {
    iVar1 = EC_KEY_generate_key((EC_KEY *)local_18._M_head_impl);
    local_80.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_80.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar1 != 0);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      pEVar3 = EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      local_80.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_80.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,pEVar3 != (EC_POINT *)0x0);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_28._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar3;
      if (pEVar3 == (EC_POINT *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_48,(internal *)&local_80,(AssertionResult *)0x56948a,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x2a7,(char *)CONCAT71(local_48._1_7_,local_48[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60);
LAB_002e68b4:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1
                         );
        }
        if (local_60._M_head_impl != (ec_point_st *)0x0) {
          (*(code *)((local_60._M_head_impl)->group->generator).group)();
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
      }
      else {
        src = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
        iVar1 = EC_POINT_copy(pEVar3,src);
        local_80.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_80.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,iVar1 != 0);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,(internal *)&local_80,
                     (AssertionResult *)"EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get()))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x2a8,(char *)CONCAT71(local_48._1_7_,local_48[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_60)
          ;
          goto LAB_002e68b4;
        }
        dst = (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
        local_80.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_80.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,dst != (ec_point_st *)0x0);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_60._M_head_impl = dst;
        if (dst == (ec_point_st *)0x0) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_48,(internal *)&local_80,(AssertionResult *)0x5694d1,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x2ab,(char *)CONCAT71(local_48._1_7_,local_48[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_68)
          ;
LAB_002e69ca:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_48._1_7_,local_48[0]),
                            local_38._M_allocated_capacity + 1);
          }
          if (local_68._M_head_impl != (ec_point_st *)0x0) {
            (*(code *)((local_68._M_head_impl)->group->generator).group)();
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
        }
        else {
          pEVar3 = EC_KEY_get0_public_key((EC_KEY *)local_18._M_head_impl);
          iVar1 = EC_POINT_copy((EC_POINT *)dst,pEVar3);
          local_80.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               CONCAT31(local_80.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._1_3_,iVar1 != 0);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_48,(internal *)&local_80,
                       (AssertionResult *)
                       "EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get()))","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x2ac,(char *)CONCAT71(local_48._1_7_,local_48[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)&local_68);
            goto LAB_002e69ca;
          }
          local_68._M_head_impl =
               (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
          local_80.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               CONCAT31(local_80.ss_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._1_3_,local_68._M_head_impl != (ec_point_st *)0x0);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_68._M_head_impl == (ec_point_st *)0x0) {
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_48,(internal *)&local_80,(AssertionResult *)"double_p1",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x2af,(char *)CONCAT71(local_48._1_7_,local_48[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_58,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_48._1_7_,local_48[0]),
                              local_38._M_allocated_capacity + 1);
            }
            if (local_50._M_head_impl != (bignum_ctx *)0x0) {
              (**(code **)((local_50._M_head_impl)->bignums + 8))();
            }
            if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,local_78);
            }
          }
          else {
            local_50._M_head_impl = (bignum_ctx *)BN_CTX_new();
            local_80.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ =
                 CONCAT31(local_80.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._1_3_,local_50._M_head_impl != (bignum_ctx *)0x0);
            local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_50._M_head_impl == (bignum_ctx *)0x0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_48,(internal *)&local_80,(AssertionResult *)0x5423a5,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x2b1,(char *)CONCAT71(local_48._1_7_,local_48[0]));
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
LAB_002e6b92:
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_48._1_7_,local_48[0]),
                                local_38._M_allocated_capacity + 1);
              }
              if (local_58._M_head_impl != (ec_point_st *)0x0) {
                (*(code *)((local_58._M_head_impl)->group->generator).group)();
              }
              if (local_78 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_78,local_78);
              }
            }
            else {
              iVar1 = EC_POINT_dbl((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_68._M_head_impl,
                                   (EC_POINT *)local_28._M_head_impl,(BN_CTX *)local_50._M_head_impl
                                  );
              local_80.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_80.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,iVar1 != 0);
              local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_48,(internal *)&local_80,
                           (AssertionResult *)
                           "EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get())","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x2b2,(char *)CONCAT71(local_48._1_7_,local_48[0]));
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
                goto LAB_002e6b92;
              }
              local_58._M_head_impl =
                   (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              local_80.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_80.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,local_58._M_head_impl != (ec_point_st *)0x0);
              local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_58._M_head_impl == (ec_point_st *)0x0) {
                testing::Message::Message((Message *)&local_70);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_48,(internal *)&local_80,(AssertionResult *)"p1_plus_p2",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_20,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x2b5,(char *)CONCAT71(local_48._1_7_,local_48[0]));
                testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_70);
LAB_002e6ca8:
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_78;
                testing::internal::AssertHelper::~AssertHelper(&local_20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_48._1_7_,local_48[0]),
                                  local_38._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,(int)local_70.data_) + 8))();
                }
                local_40 = local_78;
                if (local_78 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_002e6d46:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,local_40);
                }
              }
              else {
                iVar1 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                     (EC_POINT *)local_58._M_head_impl,
                                     (EC_POINT *)local_28._M_head_impl,
                                     (EC_POINT *)local_60._M_head_impl,
                                     (BN_CTX *)local_50._M_head_impl);
                local_80.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ =
                     CONCAT31(local_80.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._1_3_,iVar1 != 0);
                local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_48,(internal *)&local_80,
                             (AssertionResult *)
                             "EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get())"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_20,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x2b7,(char *)CONCAT71(local_48._1_7_,local_48[0]));
                  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_70);
                  goto LAB_002e6ca8;
                }
                local_80.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ = 0;
                local_70.data_._0_4_ =
                     EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                  (EC_POINT *)local_68._M_head_impl,
                                  (EC_POINT *)local_58._M_head_impl,(BN_CTX *)local_50._M_head_impl)
                ;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_48,"0",
                           "EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get())",
                           (int *)&local_80,(int *)&local_70);
                if (local_48[0] == (internal)0x0) {
                  testing::Message::Message(&local_80);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 0x10),"A+A != 2A",9);
                  if (local_40 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    message = "";
                  }
                  else {
                    message = (local_40->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x2ba,message);
                  testing::internal::AssertHelper::operator=(&local_70,&local_80);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if ((long *)CONCAT44(local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_80.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_80.ss_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_,
                                                  local_80.ss_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._0_4_) + 8))();
                  }
                }
                if (local_40 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_40;
                  goto LAB_002e6d46;
                }
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_58);
            }
            std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&local_50);
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_68);
        }
        std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_60);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_28);
      goto LAB_002e6d7d;
    }
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_80,
               (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x2a4,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_28);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
  }
  if (local_28._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
LAB_002e6d7d:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_P(ECCurveTest, AddingEqualPoints) {
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  bssl::UniquePtr<EC_POINT> p1(EC_POINT_new(group()));
  ASSERT_TRUE(p1);
  ASSERT_TRUE(EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> p2(EC_POINT_new(group()));
  ASSERT_TRUE(p2);
  ASSERT_TRUE(EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> double_p1(EC_POINT_new(group()));
  ASSERT_TRUE(double_p1);
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get()));

  bssl::UniquePtr<EC_POINT> p1_plus_p2(EC_POINT_new(group()));
  ASSERT_TRUE(p1_plus_p2);
  ASSERT_TRUE(
      EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get()));

  EXPECT_EQ(0,
            EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get()))
      << "A+A != 2A";
}